

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

BigInt * __thiscall BigInt::operator%=(BigInt *this,BigInt *b)

{
  BigInt local_38;
  BigInt *local_18;
  BigInt *b_local;
  BigInt *this_local;
  
  local_18 = b;
  b_local = this;
  operator%(&local_38,this,b);
  operator=(this,&local_38);
  ~BigInt(&local_38);
  return this;
}

Assistant:

BigInt& BigInt::operator%=(BigInt&& b) {
    *this = *this % b;
    return *this;
}